

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

bool tcu::anon_unknown_3::verifyMultisampleLineGroupInterpolation
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  pointer pSVar1;
  undefined8 *puVar2;
  ostringstream *poVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  RGBA c;
  pointer pSVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  Vec4 *pVVar10;
  Vec2 VVar11;
  Vec2 VVar12;
  Vec2 VVar13;
  CoverageType CVar14;
  long lVar15;
  MessageBuilder *pMVar16;
  ulong uVar17;
  ulong uVar18;
  RasterizationArguments *pr;
  ulong uVar19;
  RasterizationArguments *pixel;
  Surface *surface_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  long lVar20;
  int y;
  long lVar21;
  int iVar22;
  InterpolationRange *this;
  int iVar23;
  int iVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 uVar34;
  undefined4 in_XMM1_Dd;
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  Vector<float,_4> VVar41;
  uint local_5d8;
  int local_5d4;
  IVec3 colorMax;
  Vec2 lineNormalDir;
  float fStack_5b0;
  float fStack_5ac;
  TriangleSceneSpec triangleScene;
  int local_56c;
  Vector<float,_2> local_560;
  IVec3 pixelNativeColor;
  RGBA color;
  Vec2 lineScreenSpace [2];
  Vec2 maxWeights;
  Vec3 colorMinF;
  Vec2 lineDir;
  Vec2 minWeights;
  Vector<int,_3> local_458;
  Vector<int,_3> local_44c;
  IVec2 viewportSize;
  InterpolationRange weights;
  Surface errorMask;
  Vec2 lineQuadNormalizedDeviceSpace [4];
  Vector<int,_3> local_340;
  Vector<float,_2> local_330;
  int local_324;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  int local_310;
  Vector<int,_3> local_30c;
  Vector<int,_3> local_300;
  Vector<int,_3> local_2f4;
  float local_2e8;
  float fStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  Vector<float,_3> local_2c0;
  Vector<float,_3> local_2b0;
  Vector<float,_3> local_2a0;
  Vector<float,_3> local_290;
  Vector<float,_3> local_280;
  Vector<float,_3> local_270;
  Vector<int,_2> local_260;
  Vector<int,_3> local_254;
  Vec2 lineQuadScreenSpace [4];
  Vector<float,_2> local_228;
  Vector<float,_2> local_220;
  Vector<float,_2> local_218;
  Vector<float,_2> local_210 [41];
  Vector<float,_3> local_c8;
  Vector<float,_3> local_bc;
  Vector<float,_3> local_b0;
  Vector<float,_3> local_a4;
  Vector<float,_3> local_98;
  Vector<float,_3> local_8c;
  Vector<float,_3> local_80;
  Vector<float,_3> local_74;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Vector<float,_3> local_54;
  Vector<float,_3> local_48;
  tcu local_3c [12];
  
  uVar4 = surface->m_width;
  uVar5 = surface->m_height;
  local_560.m_data[0] = (float)(int)uVar4;
  local_560.m_data[1] = (float)(int)uVar5;
  fVar27 = scene->lineWidth;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  triangleScene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&triangleScene.triangles,
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  fVar27 = fVar27 * 0.5;
  iVar22 = 1;
  lVar25 = 0;
  lVar20 = 0;
  for (lVar21 = 0;
      pSVar6 = (scene->lines).
               super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar21 < (int)((ulong)((long)(scene->lines).
                                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 6);
      lVar21 = lVar21 + 1) {
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(ulong *)((long)pSVar6->positions[0].m_data + lVar25);
    uVar34 = *(undefined4 *)((long)pSVar6->positions[0].m_data + lVar25 + 0xc);
    auVar31._4_4_ = uVar34;
    auVar31._0_4_ = uVar34;
    auVar31._8_8_ = 0;
    auVar31 = divps(auVar30,auVar31);
    weights.max.m_data._0_8_ = auVar31._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)((long)(pSVar6->positions + 1) + lVar25);
    uVar34 = *(undefined4 *)((long)(pSVar6->positions + 1) + 0xcU + lVar25);
    auVar7._4_4_ = uVar34;
    auVar7._0_4_ = uVar34;
    auVar7._8_8_ = 0;
    auVar31 = divps(auVar32,auVar7);
    weights._8_8_ = auVar31._0_8_;
    lineDir.m_data[0] = 1.0;
    lineDir.m_data[1] = 1.0;
    tcu::operator+((Vector<float,_2> *)&weights,&lineDir);
    tcu::operator*(0.5,lineQuadNormalizedDeviceSpace);
    tcu::operator*(lineQuadScreenSpace,&local_560);
    minWeights.m_data[0] = 1.0;
    minWeights.m_data[1] = 1.0;
    tcu::operator+((Vector<float,_2> *)(weights.max.m_data + 2),&minWeights);
    tcu::operator*(0.5,(Vector<float,_2> *)&colorMinF);
    tcu::operator*(&lineNormalDir,&local_560);
    tcu::operator-(lineScreenSpace + 1,lineScreenSpace);
    normalize<float,2>((tcu *)&lineDir,lineQuadScreenSpace);
    lineNormalDir.m_data =
         (float  [2])(CONCAT44(lineDir.m_data[0],lineDir.m_data[1]) ^ 0x8000000000000000);
    tcu::operator*(fVar27,&lineNormalDir);
    tcu::operator+(lineScreenSpace,lineQuadNormalizedDeviceSpace);
    tcu::operator*(fVar27,&lineNormalDir);
    tcu::operator-(lineScreenSpace,(Vector<float,_2> *)&colorMinF);
    tcu::operator*(fVar27,&lineNormalDir);
    tcu::operator-(lineScreenSpace + 1,&minWeights);
    tcu::operator*(fVar27,&lineNormalDir);
    tcu::operator+(lineScreenSpace + 1,&maxWeights);
    tcu::operator/(lineQuadScreenSpace,&local_560);
    tcu::operator*(2.0,&minWeights);
    maxWeights.m_data[0] = 1.0;
    maxWeights.m_data[1] = 1.0;
    tcu::operator-((Vector<float,_2> *)&colorMinF,&maxWeights);
    tcu::operator/(lineQuadScreenSpace + 1,&local_560);
    tcu::operator*(2.0,(Vector<float,_2> *)&colorMax);
    pixelNativeColor.m_data[0] = 0x3f800000;
    pixelNativeColor.m_data[1] = 0x3f800000;
    tcu::operator-((Vector<float,_2> *)&errorMask,(Vector<float,_2> *)&pixelNativeColor);
    tcu::operator/(lineQuadScreenSpace + 2,&local_560);
    tcu::operator*(2.0,(Vector<float,_2> *)&local_2f4);
    local_330.m_data[0] = 1.0;
    local_330.m_data[1] = 1.0;
    tcu::operator-((Vector<float,_2> *)&local_44c,&local_330);
    tcu::operator/(lineQuadScreenSpace + 3,&local_560);
    tcu::operator*(2.0,(Vector<float,_2> *)&local_300);
    local_340.m_data[0] = 0x3f800000;
    local_340.m_data[1] = 0x3f800000;
    tcu::operator-((Vector<float,_2> *)&local_458,(Vector<float,_2> *)&local_340);
    lVar15 = lVar20 >> 0x20;
    in_XMM1_Db = 1.0;
    in_XMM1_Dc = 0;
    in_XMM1_Dd = 0;
    pSVar1 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar15;
    *(float (*) [2])pSVar1->positions[0].m_data = lineQuadNormalizedDeviceSpace[0].m_data;
    pSVar1->positions[0].m_data[2] = 0.0;
    pSVar1->positions[0].m_data[3] = 1.0;
    pVVar10 = triangleScene.triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar15].positions;
    *(float (*) [2])pVVar10[1].m_data = lineQuadNormalizedDeviceSpace[1].m_data;
    pVVar10[1].m_data[2] = 0.0;
    pVVar10[1].m_data[3] = 1.0;
    pVVar10 = triangleScene.triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar15].positions;
    *(ulong *)pVVar10[2].m_data =
         CONCAT44(lineQuadNormalizedDeviceSpace[2].m_data[1],
                  lineQuadNormalizedDeviceSpace[2].m_data[0]);
    pVVar10[2].m_data[2] = 0.0;
    pVVar10[2].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar15].sharedEdge[0] = false;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar15].sharedEdge[1] = false;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar15].sharedEdge[2] = true;
    puVar2 = (undefined8 *)
             ((long)((scene->lines).
                     super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ._M_impl.super__Vector_impl_data._M_start)->colors[0].m_data + lVar25);
    uVar9 = puVar2[1];
    *(undefined8 *)
     triangleScene.triangles.
     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
     ._M_impl.super__Vector_impl_data._M_start[lVar15].colors[0].m_data = *puVar2;
    *(undefined8 *)
     (triangleScene.triangles.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar15].colors[0].m_data + 2) = uVar9;
    puVar2 = (undefined8 *)
             ((long)((scene->lines).
                     super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ._M_impl.super__Vector_impl_data._M_start)->colors[0].m_data + lVar25);
    uVar9 = puVar2[1];
    *(undefined8 *)
     triangleScene.triangles.
     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
     ._M_impl.super__Vector_impl_data._M_start[lVar15].colors[1].m_data = *puVar2;
    *(undefined8 *)
     (triangleScene.triangles.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar15].colors[1].m_data + 2) = uVar9;
    puVar2 = (undefined8 *)
             ((long)(((scene->lines).
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_start)->colors + 1) + lVar25);
    uVar9 = puVar2[1];
    *(undefined8 *)
     triangleScene.triangles.
     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
     ._M_impl.super__Vector_impl_data._M_start[lVar15].colors[2].m_data = *puVar2;
    *(undefined8 *)
     (triangleScene.triangles.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar15].colors[2].m_data + 2) = uVar9;
    pSVar1 = triangleScene.triangles.
             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar22;
    *(float (*) [2])pSVar1->positions[0].m_data = lineQuadNormalizedDeviceSpace[0].m_data;
    pSVar1->positions[0].m_data[2] = 0.0;
    pSVar1->positions[0].m_data[3] = 1.0;
    pVVar10 = triangleScene.triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar22].positions;
    *(ulong *)pVVar10[1].m_data =
         CONCAT44(lineQuadNormalizedDeviceSpace[2].m_data[1],
                  lineQuadNormalizedDeviceSpace[2].m_data[0]);
    pVVar10[1].m_data[2] = 0.0;
    pVVar10[1].m_data[3] = 1.0;
    pVVar10 = triangleScene.triangles.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar22].positions;
    *(ulong *)pVVar10[2].m_data =
         CONCAT44(lineQuadNormalizedDeviceSpace[3].m_data[1],
                  lineQuadNormalizedDeviceSpace[3].m_data[0]);
    pVVar10[2].m_data[2] = 0.0;
    pVVar10[2].m_data[3] = 1.0;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar22].sharedEdge[0] = true;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar22].sharedEdge[1] = false;
    triangleScene.triangles.
    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ._M_impl.super__Vector_impl_data._M_start[iVar22].sharedEdge[2] = false;
    puVar2 = (undefined8 *)
             ((long)((scene->lines).
                     super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ._M_impl.super__Vector_impl_data._M_start)->colors[0].m_data + lVar25);
    uVar9 = puVar2[1];
    *(undefined8 *)
     triangleScene.triangles.
     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
     ._M_impl.super__Vector_impl_data._M_start[iVar22].colors[0].m_data = *puVar2;
    *(undefined8 *)
     (triangleScene.triangles.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar22].colors[0].m_data + 2) = uVar9;
    puVar2 = (undefined8 *)
             ((long)(((scene->lines).
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_start)->colors + 1) + lVar25);
    uVar9 = puVar2[1];
    *(undefined8 *)
     triangleScene.triangles.
     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
     ._M_impl.super__Vector_impl_data._M_start[iVar22].colors[1].m_data = *puVar2;
    *(undefined8 *)
     (triangleScene.triangles.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar22].colors[1].m_data + 2) = uVar9;
    puVar2 = (undefined8 *)
             ((long)(((scene->lines).
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_start)->colors + 1) + lVar25);
    uVar9 = puVar2[1];
    *(undefined8 *)
     triangleScene.triangles.
     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
     ._M_impl.super__Vector_impl_data._M_start[iVar22].colors[2].m_data = *puVar2;
    *(undefined8 *)
     (triangleScene.triangles.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar22].colors[2].m_data + 2) = uVar9;
    iVar22 = iVar22 + 2;
    lVar20 = lVar20 + 0x200000000;
    lVar25 = lVar25 + 0x40;
  }
  iVar22 = args->numSamples;
  viewportSize.m_data[0] = surface->m_width;
  viewportSize.m_data[1] = surface->m_height;
  local_5d8 = args->subpixelBits;
  Surface::Surface(&errorMask,viewportSize.m_data[0],viewportSize.m_data[1]);
  Surface::getAccess((PixelBufferAccess *)lineQuadScreenSpace,&errorMask);
  lineQuadNormalizedDeviceSpace[0].m_data[0] = 0.0;
  lineQuadNormalizedDeviceSpace[0].m_data[1] = 0.0;
  lineQuadNormalizedDeviceSpace[1].m_data[0] = 0.0;
  lineQuadNormalizedDeviceSpace[1].m_data[1] = 1.0;
  tcu::clear((PixelBufferAccess *)lineQuadScreenSpace,(Vec4 *)lineQuadNormalizedDeviceSpace);
  poVar3 = (ostringstream *)(lineQuadScreenSpace + 1);
  lineQuadScreenSpace[0].m_data = (float  [2])log;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::operator<<((ostream *)poVar3,"Verifying rasterization result. Native format is RGB");
  pMVar16 = MessageBuilder::operator<<((MessageBuilder *)lineQuadScreenSpace,&args->redBits);
  pMVar16 = MessageBuilder::operator<<(pMVar16,&args->greenBits);
  pr = args;
  pMVar16 = MessageBuilder::operator<<(pMVar16,&args->blueBits);
  MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  if (((8 < args->redBits) || (8 < args->greenBits)) || (8 < args->blueBits)) {
    poVar3 = (ostringstream *)(lineQuadScreenSpace + 1);
    lineQuadScreenSpace[0].m_data = (float  [2])log;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,
                    "Warning! More than 8 bits in a color channel, this may produce false negatives."
                   );
    MessageBuilder::operator<<
              ((MessageBuilder *)lineQuadScreenSpace,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
  }
  if ((int)local_5d8 < 0) {
    poVar3 = (ostringstream *)(lineQuadScreenSpace + 1);
    lineQuadScreenSpace[0].m_data = (float  [2])log;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"Invalid subpixel count (");
    std::ostream::operator<<(poVar3,local_5d8);
    std::operator<<((ostream *)poVar3,"), assuming 0");
    MessageBuilder::operator<<
              ((MessageBuilder *)lineQuadScreenSpace,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    local_5d8 = 0;
  }
  else if (0x10 < local_5d8) {
    poVar3 = (ostringstream *)(lineQuadScreenSpace + 1);
    lineQuadScreenSpace[0].m_data = (float  [2])log;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"Subpixel count is greater than 16 (");
    std::ostream::operator<<(poVar3,local_5d8);
    std::operator<<((ostream *)poVar3,
                    "). Checking results using less strict 16 bit requirements. This may produce false positives."
                   );
    MessageBuilder::operator<<
              ((MessageBuilder *)lineQuadScreenSpace,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    local_5d8 = 0x10;
  }
  local_56c = 0;
  fVar27 = 0.0;
  local_5d4 = 0;
  do {
    if (surface->m_height <= (int)fVar27) {
      if (4 < local_5d4) {
        poVar3 = (ostringstream *)(lineQuadScreenSpace + 1);
        lineQuadScreenSpace[0].m_data = (float  [2])log;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,"Omitted ");
        std::ostream::operator<<(poVar3,local_5d4 + -4);
        std::operator<<((ostream *)poVar3," pixel error description(s).");
        MessageBuilder::operator<<
                  ((MessageBuilder *)lineQuadScreenSpace,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
      }
      poVar3 = (ostringstream *)(lineQuadScreenSpace + 1);
      iVar22 = (int)log;
      if (local_56c == 0) {
        lineQuadScreenSpace[0].m_data = (float  [2])log;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,"No invalid pixels found.");
        MessageBuilder::operator<<
                  ((MessageBuilder *)lineQuadScreenSpace,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&weights,"Verification result",(allocator<char> *)&colorMinF);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)lineScreenSpace,"Result of rendering",(allocator<char> *)&minWeights);
        LogImageSet::LogImageSet
                  ((LogImageSet *)lineQuadNormalizedDeviceSpace,(string *)&weights,
                   (string *)lineScreenSpace);
        LogImageSet::write((LogImageSet *)lineQuadNormalizedDeviceSpace,iVar22,__buf_02,(size_t)pr);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lineDir,"Result",(allocator<char> *)&maxWeights);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lineNormalDir,"Result",(allocator<char> *)&colorMax);
        LogImage::LogImage((LogImage *)lineQuadScreenSpace,(string *)&lineDir,
                           (string *)&lineNormalDir,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)lineQuadScreenSpace,iVar22,__buf_03,(size_t)surface);
        TestLog::endImageSet(log);
        LogImage::~LogImage((LogImage *)lineQuadScreenSpace);
        std::__cxx11::string::~string((string *)&lineNormalDir);
        std::__cxx11::string::~string((string *)&lineDir);
        LogImageSet::~LogImageSet((LogImageSet *)lineQuadNormalizedDeviceSpace);
        std::__cxx11::string::~string((string *)lineScreenSpace);
        this = &weights;
      }
      else {
        lineQuadScreenSpace[0].m_data = (float  [2])log;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::ostream::operator<<(poVar3,local_56c);
        std::operator<<((ostream *)poVar3," invalid pixel(s) found.");
        MessageBuilder::operator<<
                  ((MessageBuilder *)lineQuadScreenSpace,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)lineScreenSpace,"Verification result",(allocator<char> *)&colorMax);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lineDir,"Result of rendering",(allocator<char> *)&pixelNativeColor);
        LogImageSet::LogImageSet
                  ((LogImageSet *)&weights,(string *)lineScreenSpace,(string *)&lineDir);
        LogImageSet::write((LogImageSet *)&weights,iVar22,__buf,(size_t)pr);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lineNormalDir,"Result",(allocator<char> *)&local_44c);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&colorMinF,"Result",(allocator<char> *)&local_2f4);
        LogImage::LogImage((LogImage *)lineQuadScreenSpace,(string *)&lineNormalDir,
                           (string *)&colorMinF,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)lineQuadScreenSpace,iVar22,__buf_00,(size_t)surface);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&minWeights,"ErrorMask",(allocator<char> *)&local_330);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&maxWeights,"ErrorMask",(allocator<char> *)&local_458);
        surface_00 = &errorMask;
        LogImage::LogImage((LogImage *)lineQuadNormalizedDeviceSpace,(string *)&minWeights,
                           (string *)&maxWeights,surface_00,QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)lineQuadNormalizedDeviceSpace,iVar22,__buf_01,(size_t)surface_00
                       );
        TestLog::endImageSet(log);
        LogImage::~LogImage((LogImage *)lineQuadNormalizedDeviceSpace);
        std::__cxx11::string::~string((string *)&maxWeights);
        std::__cxx11::string::~string((string *)&minWeights);
        LogImage::~LogImage((LogImage *)lineQuadScreenSpace);
        std::__cxx11::string::~string((string *)&colorMinF);
        std::__cxx11::string::~string((string *)&lineNormalDir);
        LogImageSet::~LogImageSet((LogImageSet *)&weights);
        std::__cxx11::string::~string((string *)&lineDir);
        this = (InterpolationRange *)lineScreenSpace;
      }
      std::__cxx11::string::~string((string *)this);
      Surface::~Surface(&errorMask);
      std::
      _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&triangleScene);
      return local_56c == 0;
    }
    fVar33 = (float)(int)fVar27;
    for (fVar26 = 0.0; (int)fVar26 < surface->m_width; fVar26 = (float)((int)fVar26 + 1)) {
      c.m_value = *(deUint32 *)
                   ((long)(surface->m_pixels).m_ptr +
                   (long)(surface->m_width * (int)fVar27 + (int)fVar26) * 4);
      color.m_value = c.m_value;
      Vector<float,_4>::Vector((Vector<float,_4> *)lineScreenSpace);
      Vector<float,_4>::Vector((Vector<float,_4> *)&lineDir);
      uVar17 = ((long)triangleScene.triangles.
                      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)triangleScene.triangles.
                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 100;
      local_2d8 = (float)(int)fVar26;
      local_2e8 = local_2d8 + 1.0;
      pr = (RasterizationArguments *)0x64;
      fVar29 = in_XMM1_Db;
      uVar34 = in_XMM1_Dc;
      uVar35 = in_XMM1_Dd;
      VVar11 = lineScreenSpace[0];
      VVar12 = lineScreenSpace[1];
      VVar13 = lineDir;
      iVar24 = 0;
LAB_0162c139:
      do {
        do {
          iVar23 = iVar24;
          lineDir.m_data = VVar13.m_data;
          lineScreenSpace[1].m_data = VVar12.m_data;
          lineScreenSpace[0].m_data = VVar11.m_data;
          pixel = (RasterizationArguments *)lineQuadScreenSpace;
          uVar17 = uVar17 - 1;
          if ((int)uVar17 < 0) {
            in_XMM1_Db = fVar29;
            in_XMM1_Dc = uVar34;
            in_XMM1_Dd = uVar35;
            if (iVar23 != 0) {
              lineScreenSpace[0].m_data[0] = 0.0;
              lineScreenSpace[0].m_data[1] = 0.0;
              lineScreenSpace[1].m_data[0] = 0.0;
              lineScreenSpace[1].m_data[1] = 1.0;
              if (iVar23 != -1) goto LAB_0162c6e3;
            }
LAB_0162ce9d:
            convertRGB8ToNativeFormat((anon_unknown_3 *)lineQuadNormalizedDeviceSpace,&color,args);
            poVar3 = (ostringstream *)(lineQuadScreenSpace + 1);
            if ((((int)lineQuadNormalizedDeviceSpace[0].m_data[0] < 2) &&
                ((int)lineQuadNormalizedDeviceSpace[0].m_data[1] < 2)) &&
               ((int)lineQuadNormalizedDeviceSpace[1].m_data[0] < 2)) goto LAB_0162cfdc;
            if (3 < local_5d4 + 1) goto LAB_0162cfb2;
            lineQuadScreenSpace[0].m_data = (float  [2])log;
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::operator<<((ostream *)poVar3,"Found an invalid pixel at (");
            std::ostream::operator<<(poVar3,(int)fVar26);
            std::operator<<((ostream *)poVar3,",");
            std::ostream::operator<<(poVar3,(int)fVar27);
            std::operator<<((ostream *)poVar3,")\n");
            std::operator<<((ostream *)poVar3,"\tPixel color:\t\t");
            tcu::operator<<((ostream *)poVar3,c);
            std::operator<<((ostream *)poVar3,"\n");
            std::operator<<((ostream *)poVar3,"\tExpected background color.\n");
            MessageBuilder::operator<<
                      ((MessageBuilder *)lineQuadScreenSpace,(EndMessageToken *)&TestLog::EndMessage
                      );
            goto LAB_0162cfaa;
          }
          uVar19 = uVar17 & 0xffffffff;
          lineQuadScreenSpace[0].m_data[1] = fVar27;
          lineQuadScreenSpace[0].m_data[0] = fVar26;
          CVar14 = calculateTriangleCoverage
                             (triangleScene.triangles.
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].positions,
                              triangleScene.triangles.
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].positions + 1,
                              triangleScene.triangles.
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].positions + 2,
                              (IVec2 *)pixel,&viewportSize,local_5d8,iVar22 != 0);
          pr = pixel;
          VVar11 = lineScreenSpace[0];
          VVar12 = lineScreenSpace[1];
          VVar13 = lineDir;
          iVar24 = iVar23;
        } while (COVERAGE_PARTIAL < CVar14);
        Vector<int,_2>::Vector(&local_260,&viewportSize);
        uVar18 = uVar17 >> 1 & 0x7fffffff;
        lineQuadNormalizedDeviceSpace[0].m_data[1] = fVar33;
        lineQuadNormalizedDeviceSpace[0].m_data[0] = local_2d8;
        lineQuadNormalizedDeviceSpace[1].m_data[1] = fVar33 + 1.0;
        lineQuadNormalizedDeviceSpace[1].m_data[0] = local_2d8;
        lineQuadNormalizedDeviceSpace[2].m_data[0] = local_2e8;
        lineQuadNormalizedDeviceSpace[3].m_data[0] = local_2e8;
        pSVar6 = (scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fVar29 = *(float *)((long)pSVar6[uVar18].positions[0].m_data + 0xc);
        fVar38 = *(float *)((long)(pSVar6[uVar18].positions + 1) + 0xc);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)pSVar6[uVar18].positions[0].m_data;
        auVar8._4_4_ = fVar29;
        auVar8._0_4_ = fVar29;
        auVar8._8_8_ = 0;
        auVar31 = divps(auVar36,auVar8);
        in_XMM3_Db = 1.0;
        in_XMM3_Dc = 0;
        in_XMM3_Dd = 0;
        lineNormalDir.m_data[0] = (auVar31._0_4_ + 1.0) * 0.5 * (float)local_260.m_data[0];
        lineNormalDir.m_data[1] = (auVar31._4_4_ + 1.0) * 0.5 * (float)local_260.m_data[1];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)pSVar6[uVar18].positions[1].m_data;
        auVar37._4_4_ = fVar38;
        auVar37._0_4_ = fVar38;
        auVar37._8_8_ = 0;
        auVar31 = divps(auVar40,auVar37);
        colorMinF.m_data[0] = (auVar31._0_4_ + 1.0) * 0.5 * (float)local_260.m_data[0];
        colorMinF.m_data[1] = (auVar31._4_4_ + 1.0) * 0.5 * (float)local_260.m_data[1];
        lineQuadNormalizedDeviceSpace[2].m_data[1] = fVar33 + 1.0;
        lineQuadNormalizedDeviceSpace[3].m_data[1] = fVar33;
        calcLineInterpolationWeights
                  ((anon_unknown_3 *)lineQuadScreenSpace,&lineNormalDir,fVar29,(Vec2 *)&colorMinF,
                   fVar38,lineQuadNormalizedDeviceSpace);
        calcLineInterpolationWeights
                  ((anon_unknown_3 *)(lineQuadScreenSpace + 2),&lineNormalDir,fVar29,
                   (Vec2 *)&colorMinF,fVar38,lineQuadNormalizedDeviceSpace + 1);
        calcLineInterpolationWeights
                  ((anon_unknown_3 *)&local_228,&lineNormalDir,fVar29,(Vec2 *)&colorMinF,fVar38,
                   lineQuadNormalizedDeviceSpace + 2);
        pr = (RasterizationArguments *)(lineQuadNormalizedDeviceSpace + 3);
        calcLineInterpolationWeights
                  ((anon_unknown_3 *)&local_218,&lineNormalDir,fVar29,(Vec2 *)&colorMinF,fVar38,
                   (Vec2 *)pr);
        min<float,2>(lineQuadScreenSpace + 1,lineQuadScreenSpace + 3);
        min<float,2>(&local_220,local_210);
        min<float,2>(&maxWeights,(Vector<float,_2> *)&colorMax);
        max<float,2>(lineQuadScreenSpace,lineQuadScreenSpace + 2);
        max<float,2>(&local_228,&local_218);
        max<float,2>((Vector<float,_2> *)&colorMax,(Vector<float,_2> *)&pixelNativeColor);
        InterpolationRange::InterpolationRange(&weights);
        weights.min.m_data[1] = 0.0;
        weights.min.m_data[2] = minWeights.m_data[1];
        weights.max.m_data._0_8_ = (ulong)maxWeights.m_data & 0xffffffff;
        weights.min.m_data[0] = minWeights.m_data[0];
        weights.max.m_data[2] = maxWeights.m_data[1];
        fVar29 = 1.0;
        if (maxWeights.m_data[0] <= 1.0) {
          fVar29 = maxWeights.m_data[0];
        }
        tcu::operator*((tcu *)&lineNormalDir,
                       (float)(~-(uint)(maxWeights.m_data[0] < 0.0) & (uint)fVar29),
                       triangleScene.triangles.
                       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].colors);
        fVar29 = 1.0;
        if (weights.max.m_data[1] <= 1.0) {
          fVar29 = weights.max.m_data[1];
        }
        tcu::operator*((tcu *)&colorMinF,
                       (float)(~-(uint)(weights.max.m_data[1] < 0.0) & (uint)fVar29),
                       triangleScene.triangles.
                       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].colors + 1);
        tcu::operator+((tcu *)lineQuadNormalizedDeviceSpace,(Vector<float,_4> *)&lineNormalDir,
                       (Vector<float,_4> *)&colorMinF);
        fVar29 = 1.0;
        if (weights.max.m_data[2] <= 1.0) {
          fVar29 = weights.max.m_data[2];
        }
        tcu::operator*((tcu *)&minWeights,
                       (float)(~-(uint)(weights.max.m_data[2] < 0.0) & (uint)fVar29),
                       triangleScene.triangles.
                       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].colors + 2);
        tcu::operator+((tcu *)lineQuadScreenSpace,(Vector<float,_4> *)lineQuadNormalizedDeviceSpace,
                       (Vector<float,_4> *)&minWeights);
        fVar29 = 1.0;
        if (weights.min.m_data[0] <= 1.0) {
          fVar29 = weights.min.m_data[0];
        }
        tcu::operator*((tcu *)&colorMinF,
                       (float)(~-(uint)(weights.min.m_data[0] < 0.0) & (uint)fVar29),
                       triangleScene.triangles.
                       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].colors);
        fVar29 = 1.0;
        if (weights.min.m_data[1] <= 1.0) {
          fVar29 = weights.min.m_data[1];
        }
        tcu::operator*((tcu *)&minWeights,
                       (float)(~-(uint)(weights.min.m_data[1] < 0.0) & (uint)fVar29),
                       triangleScene.triangles.
                       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].colors + 1);
        tcu::operator+((tcu *)&lineNormalDir,(Vector<float,_4> *)&colorMinF,
                       (Vector<float,_4> *)&minWeights);
        uVar34 = 0;
        uVar35 = 0;
        fVar29 = 1.0;
        if (weights.min.m_data[2] <= 1.0) {
          fVar29 = weights.min.m_data[2];
        }
        tcu::operator*((tcu *)&maxWeights,
                       (float)(~-(uint)(weights.min.m_data[2] < 0.0) & (uint)fVar29),
                       triangleScene.triangles.
                       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].colors + 2);
        VVar41 = tcu::operator+((tcu *)lineQuadNormalizedDeviceSpace,
                                (Vector<float,_4> *)&lineNormalDir,(Vector<float,_4> *)&maxWeights);
        fVar29 = VVar41.m_data[3];
        iVar24 = iVar23 + 1;
        if (iVar23 != 0) {
          min<float,4>((tcu *)&lineNormalDir,(Vector<float,_4> *)lineScreenSpace,
                       (Vector<float,_4> *)lineQuadNormalizedDeviceSpace);
          lineScreenSpace[1].m_data[1] = fStack_5ac;
          lineScreenSpace[1].m_data[0] = fStack_5b0;
          lineScreenSpace[0] = lineNormalDir;
          VVar41 = max<float,4>((tcu *)&lineNormalDir,(Vector<float,_4> *)&lineDir,
                                (Vector<float,_4> *)lineQuadScreenSpace);
          fVar29 = VVar41.m_data[3];
          VVar13.m_data[0] = lineNormalDir.m_data[0];
          VVar13.m_data[1] = lineNormalDir.m_data[1];
          lineDir = lineNormalDir;
          VVar11 = lineScreenSpace[0];
          VVar12.m_data = lineScreenSpace[1].m_data;
          if (CVar14 == COVERAGE_FULL) {
            in_XMM1_Db = fVar29;
            in_XMM1_Dc = uVar34;
            in_XMM1_Dd = uVar35;
            if (iVar24 == 0) goto LAB_0162ce9d;
            break;
          }
          goto LAB_0162c139;
        }
        VVar11.m_data[0] = lineQuadNormalizedDeviceSpace[0].m_data[0];
        VVar11.m_data[1] = lineQuadNormalizedDeviceSpace[0].m_data[1];
        VVar12.m_data[0] = lineQuadNormalizedDeviceSpace[1].m_data[0];
        VVar12.m_data[1] = lineQuadNormalizedDeviceSpace[1].m_data[1];
        lineScreenSpace[0] = lineQuadNormalizedDeviceSpace[0];
        lineScreenSpace[1] = lineQuadNormalizedDeviceSpace[1];
        lineDir = lineQuadScreenSpace[0];
        VVar13 = lineDir;
      } while (CVar14 != COVERAGE_FULL);
LAB_0162c6e3:
      in_XMM1_Dd = in_XMM3_Dd;
      in_XMM1_Dc = in_XMM3_Dc;
      in_XMM1_Db = in_XMM3_Db;
      lineQuadScreenSpace[0].m_data = (float  [2])lineScreenSpace;
      lineQuadScreenSpace[1].m_data[0] = 0.0;
      lineQuadScreenSpace[1].m_data[1] = 1.4013e-45;
      lineQuadScreenSpace[2].m_data[0] = 2.8026e-45;
      VecAccess::operator_cast_to_Vector((VecAccess *)lineQuadNormalizedDeviceSpace);
      lineQuadScreenSpace[0].m_data = (float  [2])&lineDir;
      lineQuadScreenSpace[1].m_data[0] = 0.0;
      lineQuadScreenSpace[1].m_data[1] = 1.4013e-45;
      lineQuadScreenSpace[2].m_data[0] = 2.8026e-45;
      VecAccess::operator_cast_to_Vector((VecAccess *)&weights);
      lineNormalDir.m_data[0] = (float)~(-1 << ((byte)args->redBits & 0x1f));
      lineNormalDir.m_data[1] = (float)~(-1 << ((byte)args->greenBits & 0x1f));
      fStack_5b0 = (float)~(-1 << ((byte)args->blueBits & 0x1f));
      local_68 = (float)(int)lineNormalDir.m_data[0];
      fVar28 = lineQuadNormalizedDeviceSpace[0].m_data[0] * local_68;
      fVar38 = local_68;
      if (fVar28 <= local_68) {
        fVar38 = fVar28;
      }
      colorMinF.m_data[0] = (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar38);
      local_2e8 = (float)(int)lineNormalDir.m_data[1];
      fVar28 = lineQuadNormalizedDeviceSpace[0].m_data[1] * local_2e8;
      fVar38 = local_2e8;
      if (fVar28 <= local_2e8) {
        fVar38 = fVar28;
      }
      local_2d8 = (float)(int)fStack_5b0;
      fVar38 = (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar38);
      fVar39 = lineQuadNormalizedDeviceSpace[1].m_data[0] * local_2d8;
      fVar28 = local_2d8;
      if (fVar39 <= local_2d8) {
        fVar28 = fVar39;
      }
      fVar28 = (float)(~-(uint)(fVar39 < 0.0) & (uint)fVar28);
      fVar39 = weights.max.m_data[0] * local_68;
      if (fVar39 <= local_68) {
        local_68 = fVar39;
      }
      local_68 = (float)(~-(uint)(fVar39 < 0.0) & (uint)local_68);
      fVar39 = weights.max.m_data[1] * local_2e8;
      if (fVar39 <= local_2e8) {
        local_2e8 = fVar39;
      }
      local_2e8 = (float)(~-(uint)(fVar39 < 0.0) & (uint)local_2e8);
      fVar39 = weights.max.m_data[2] * local_2d8;
      if (fVar39 <= local_2d8) {
        local_2d8 = fVar39;
      }
      local_2d8 = (float)(~-(uint)(fVar39 < 0.0) & (uint)local_2d8);
      minWeights.m_data[1] = local_2e8;
      minWeights.m_data[0] = local_68;
      in_XMM3_Db = in_XMM1_Db;
      in_XMM3_Dc = in_XMM1_Dc;
      in_XMM3_Dd = in_XMM1_Dd;
      colorMinF.m_data[1] = fVar38;
      colorMinF.m_data[2] = fVar28;
      fStack_2e4 = fVar29;
      uStack_2e0 = uVar34;
      uStack_2dc = uVar35;
      fStack_2d4 = in_XMM1_Db;
      uStack_2d0 = in_XMM1_Dc;
      uStack_2cc = in_XMM1_Dd;
      fStack_64 = fVar29;
      uStack_60 = uVar34;
      uStack_5c = uVar35;
      fVar29 = floorf(colorMinF.m_data[0]);
      fVar38 = floorf(fVar38);
      fVar28 = floorf(fVar28);
      maxWeights.m_data[1] = (float)(int)fVar38;
      maxWeights.m_data[0] = (float)(int)fVar29;
      fVar29 = ceilf(local_68);
      fVar38 = ceilf(local_2e8);
      fVar39 = ceilf(local_2d8);
      colorMax.m_data[1] = (int)fVar38;
      colorMax.m_data[2] = (int)fVar39;
      colorMax.m_data[0] = (int)fVar29;
      convertRGB8ToNativeFormat((anon_unknown_3 *)&pixelNativeColor,&color,args);
      if (pixelNativeColor.m_data[0] < (int)maxWeights.m_data[0] - iVar23) {
LAB_0162c9b2:
        poVar3 = (ostringstream *)(lineQuadScreenSpace + 1);
        if (local_5d4 + 1 < 5) {
          lineQuadScreenSpace[0].m_data = (float  [2])log;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::operator<<((ostream *)poVar3,"Found an invalid pixel at (");
          std::ostream::operator<<(poVar3,(int)fVar26);
          std::operator<<((ostream *)poVar3,",");
          std::ostream::operator<<(poVar3,(int)fVar27);
          std::operator<<((ostream *)poVar3,")\n");
          std::operator<<((ostream *)poVar3,"\tPixel color:\t\t");
          tcu::operator<<((ostream *)poVar3,c);
          std::operator<<((ostream *)poVar3,"\n");
          std::operator<<((ostream *)poVar3,"\tNative color:\t\t");
          tcu::operator<<((ostream *)poVar3,&pixelNativeColor);
          std::operator<<((ostream *)poVar3,"\n");
          std::operator<<((ostream *)poVar3,"\tAllowed error:\t\t");
          local_44c.m_data[0] = iVar23;
          local_44c.m_data[1] = iVar23;
          local_44c.m_data[2] = iVar23;
          tcu::operator<<((ostream *)poVar3,&local_44c);
          std::operator<<((ostream *)poVar3,"\n");
          std::operator<<((ostream *)poVar3,"\tReference native color min: ");
          local_458.m_data[0] = iVar23;
          local_458.m_data[1] = iVar23;
          local_458.m_data[2] = iVar23;
          tcu::operator-((tcu *)&local_330,(Vector<int,_3> *)&maxWeights,&local_458);
          local_300.m_data[0] = 0;
          local_300.m_data[1] = 0;
          local_300.m_data[2] = 0;
          clamp<int,3>((tcu *)&local_2f4,(Vector<int,_3> *)&local_330,&local_300,
                       (Vector<int,_3> *)&lineNormalDir);
          tcu::operator<<((ostream *)poVar3,&local_2f4);
          std::operator<<((ostream *)poVar3,"\n");
          std::operator<<((ostream *)poVar3,"\tReference native color max: ");
          local_30c.m_data[0] = iVar23;
          local_30c.m_data[1] = iVar23;
          local_30c.m_data[2] = iVar23;
          tcu::operator+(local_3c,&colorMax,&local_30c);
          local_254.m_data[0] = 0;
          local_254.m_data[1] = 0;
          local_254.m_data[2] = 0;
          clamp<int,3>((tcu *)&local_340,(Vector<int,_3> *)local_3c,&local_254,
                       (Vector<int,_3> *)&lineNormalDir);
          tcu::operator<<((ostream *)poVar3,&local_340);
          std::operator<<((ostream *)poVar3,"\n");
          std::operator<<((ostream *)poVar3,"\tReference native float min: ");
          local_318 = iVar23;
          local_314 = iVar23;
          local_310 = iVar23;
          Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_48);
          tcu::operator-((tcu *)&local_80,&colorMinF,&local_48);
          local_270.m_data[0] = 0.0;
          local_270.m_data[1] = 0.0;
          local_270.m_data[2] = 0.0;
          Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_8c);
          clamp<float,3>((tcu *)&local_74,&local_80,&local_270,&local_8c);
          tcu::operator<<((ostream *)poVar3,&local_74);
          std::operator<<((ostream *)poVar3,"\n");
          std::operator<<((ostream *)poVar3,"\tReference native float max: ");
          local_324 = iVar23;
          local_320 = iVar23;
          local_31c = iVar23;
          Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_54);
          tcu::operator+((tcu *)&local_a4,(Vector<float,_3> *)&minWeights,&local_54);
          local_280.m_data[0] = 0.0;
          local_280.m_data[1] = 0.0;
          local_280.m_data[2] = 0.0;
          Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_b0);
          clamp<float,3>((tcu *)&local_98,&local_a4,&local_280,&local_b0);
          tcu::operator<<((ostream *)poVar3,&local_98);
          std::operator<<((ostream *)poVar3,"\n");
          std::operator<<((ostream *)poVar3,"\tFmin:\t");
          local_290.m_data[0] = 0.0;
          local_290.m_data[1] = 0.0;
          local_290.m_data[2] = 0.0;
          local_2a0.m_data[0] = 1.0;
          local_2a0.m_data[1] = 1.0;
          local_2a0.m_data[2] = 1.0;
          clamp<float,3>((tcu *)&local_bc,(Vector<float,_3> *)lineQuadNormalizedDeviceSpace,
                         &local_290,&local_2a0);
          tcu::operator<<((ostream *)poVar3,&local_bc);
          std::operator<<((ostream *)poVar3,"\n");
          std::operator<<((ostream *)poVar3,"\tFmax:\t");
          local_2b0.m_data[0] = 0.0;
          local_2b0.m_data[1] = 0.0;
          local_2b0.m_data[2] = 0.0;
          local_2c0.m_data[0] = 1.0;
          local_2c0.m_data[1] = 1.0;
          local_2c0.m_data[2] = 1.0;
          clamp<float,3>((tcu *)&local_c8,&weights.max,&local_2b0,&local_2c0);
          tcu::operator<<((ostream *)poVar3,&local_c8);
          std::operator<<((ostream *)poVar3,"\n");
          MessageBuilder::operator<<
                    ((MessageBuilder *)lineQuadScreenSpace,(EndMessageToken *)&TestLog::EndMessage);
LAB_0162cfaa:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(lineQuadScreenSpace + 1));
        }
LAB_0162cfb2:
        local_5d4 = local_5d4 + 1;
        local_56c = local_56c + 1;
        *(undefined4 *)
         ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * (int)fVar27 + (int)fVar26) * 4
         ) = 0xff0000ff;
        pr = (RasterizationArguments *)errorMask.m_pixels.m_ptr;
      }
      else if (((pixelNativeColor.m_data[1] < (int)maxWeights.m_data[1] - iVar23) ||
               (pixelNativeColor.m_data[2] < (int)fVar28 - iVar23)) ||
              ((colorMax.m_data[0] + iVar23 < pixelNativeColor.m_data[0] ||
               ((colorMax.m_data[1] + iVar23 < pixelNativeColor.m_data[1] ||
                (pr = (RasterizationArguments *)(ulong)(uint)pixelNativeColor.m_data[1],
                colorMax.m_data[2] + iVar23 < pixelNativeColor.m_data[2])))))) goto LAB_0162c9b2;
LAB_0162cfdc:
    }
    fVar27 = (float)((int)fVar27 + 1);
  } while( true );
}

Assistant:

bool verifyMultisampleLineGroupInterpolation (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	// Multisampled line == 2 triangles

	const tcu::Vec2		viewportSize	= tcu::Vec2((float)surface.getWidth(), (float)surface.getHeight());
	const float			halfLineWidth	= scene.lineWidth * 0.5f;
	TriangleSceneSpec	triangleScene;

	triangleScene.triangles.resize(2 * scene.lines.size());
	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		// Transform to screen space, add pixel offsets, convert back to normalized device space, and test as triangles
		const tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(scene.lines[lineNdx].positions[0].x() / scene.lines[lineNdx].positions[0].w(), scene.lines[lineNdx].positions[0].y() / scene.lines[lineNdx].positions[0].w()),
			tcu::Vec2(scene.lines[lineNdx].positions[1].x() / scene.lines[lineNdx].positions[1].w(), scene.lines[lineNdx].positions[1].y() / scene.lines[lineNdx].positions[1].w()),
		};
		const tcu::Vec2 lineScreenSpace[2] =
		{
			(lineNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
			(lineNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
		};

		const tcu::Vec2 lineDir			= tcu::normalize(lineScreenSpace[1] - lineScreenSpace[0]);
		const tcu::Vec2 lineNormalDir	= tcu::Vec2(lineDir.y(), -lineDir.x());

		const tcu::Vec2 lineQuadScreenSpace[4] =
		{
			lineScreenSpace[0] + lineNormalDir * halfLineWidth,
			lineScreenSpace[0] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] + lineNormalDir * halfLineWidth,
		};
		const tcu::Vec2 lineQuadNormalizedDeviceSpace[4] =
		{
			lineQuadScreenSpace[0] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[1] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[2] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[3] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
		};

		triangleScene.triangles[lineNdx*2 + 0].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 0].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[1].x(), lineQuadNormalizedDeviceSpace[1].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 0].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);

		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[0] = false;
		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 0].sharedEdge[2] = true;

		triangleScene.triangles[lineNdx*2 + 0].colors[0] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 0].colors[1] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 0].colors[2] = scene.lines[lineNdx].colors[1];

		triangleScene.triangles[lineNdx*2 + 1].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 1].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);
		triangleScene.triangles[lineNdx*2 + 1].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[3].x(), lineQuadNormalizedDeviceSpace[3].y(), 0.0f, 1.0f);

		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[0] = true;
		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 1].sharedEdge[2] = false;

		triangleScene.triangles[lineNdx*2 + 1].colors[0] = scene.lines[lineNdx].colors[0];
		triangleScene.triangles[lineNdx*2 + 1].colors[1] = scene.lines[lineNdx].colors[1];
		triangleScene.triangles[lineNdx*2 + 1].colors[2] = scene.lines[lineNdx].colors[1];
	}

	return verifyTriangleGroupInterpolationWithInterpolator(surface, triangleScene, args, log, MultisampleLineInterpolator(scene));
}